

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  size_type sVar9;
  float *pfVar10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar11;
  undefined1 auVar12 [16];
  __m128 _p1_7;
  __m128 _p_7;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob2_3;
  size_t b_3;
  __m128 _p1_6;
  __m128 _p_6;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_3;
  __m128 _p_5;
  __m128 _p1_5;
  __m128 _coeff;
  int i_5;
  float coeff;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  Mat *bottom_blob2_2;
  size_t b_2;
  __m128 _p1_4;
  __m128 _p_4;
  __m128 _coeff1;
  __m128 _coeff0;
  int i_4;
  float coeff1;
  float coeff0;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  Mat *bottom_blob1_2;
  __m128 _p1_3;
  __m128 _p_3;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob2_1;
  size_t b_1;
  __m128 _p1_2;
  __m128 _p_2;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_1;
  __m128 _p1_1;
  __m128 _p_1;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob2;
  size_t b;
  __m128 _p1;
  __m128 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m_18;
  Mat *m_16;
  Mat *m_15;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_19;
  Mat *m_17;
  Mat *m_14;
  Mat *m_12;
  Mat *m_9;
  Mat *m_7;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_ffffffffffffe0d0;
  Mat *in_stack_ffffffffffffe0d8;
  Mat *in_stack_ffffffffffffe0e0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  int local_1bc4;
  undefined8 local_1bc0;
  undefined8 local_1bb8;
  undefined8 local_1bb0;
  undefined4 local_1ba8;
  Allocator *local_1ba0;
  undefined4 local_1b98;
  undefined4 local_1b94;
  undefined4 local_1b90;
  undefined4 local_1b8c;
  undefined4 local_1b88;
  undefined8 local_1b80;
  undefined1 (*local_1b78) [16];
  undefined8 local_1b70;
  undefined8 local_1b68;
  undefined8 local_1b60;
  undefined4 local_1b58;
  Allocator *local_1b50;
  undefined4 local_1b48;
  undefined4 local_1b44;
  undefined4 local_1b40;
  undefined4 local_1b3c;
  undefined4 local_1b38;
  undefined8 local_1b30;
  undefined1 (*local_1b28) [16];
  int local_1b1c;
  const_reference local_1b18;
  ulong local_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined1 local_1af8 [16];
  int local_1adc;
  undefined8 local_1ad8;
  undefined8 local_1ad0;
  undefined8 local_1ac8;
  undefined4 local_1ac0;
  Allocator *local_1ab8;
  undefined4 local_1ab0;
  undefined4 local_1aac;
  undefined4 local_1aa8;
  undefined4 local_1aa4;
  undefined4 local_1aa0;
  undefined8 local_1a98;
  undefined1 (*local_1a90) [16];
  undefined8 local_1a88;
  undefined8 local_1a80;
  undefined8 local_1a78;
  undefined4 local_1a70;
  Allocator *local_1a68;
  undefined4 local_1a60;
  undefined4 local_1a5c;
  undefined4 local_1a58;
  undefined4 local_1a54;
  undefined4 local_1a50;
  undefined8 local_1a48;
  undefined1 (*local_1a40) [16];
  undefined8 local_1a38;
  undefined8 local_1a30;
  undefined8 local_1a28;
  undefined4 local_1a20;
  Allocator *local_1a18;
  undefined4 local_1a10;
  undefined4 local_1a0c;
  undefined4 local_1a08;
  undefined4 local_1a04;
  undefined4 local_1a00;
  undefined8 local_19f8;
  undefined1 (*local_19f0) [16];
  int local_19e4;
  const_reference local_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  int local_19a8;
  float local_19a4;
  undefined8 local_19a0;
  undefined8 local_1998;
  undefined8 local_1990;
  undefined4 local_1988;
  Allocator *local_1980;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined8 local_1960;
  float *local_1958;
  undefined8 local_1950;
  undefined8 local_1948;
  undefined8 local_1940;
  undefined4 local_1938;
  Allocator *local_1930;
  undefined4 local_1928;
  undefined4 local_1924;
  undefined4 local_1920;
  undefined4 local_191c;
  undefined4 local_1918;
  undefined8 local_1910;
  float *local_1908;
  int local_18fc;
  const_reference local_18f8;
  ulong local_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  int local_18a4;
  float local_18a0;
  float local_189c;
  undefined8 local_1898;
  undefined8 local_1890;
  undefined8 local_1888;
  undefined4 local_1880;
  Allocator *local_1878;
  undefined4 local_1870;
  undefined4 local_186c;
  undefined4 local_1868;
  undefined4 local_1864;
  undefined4 local_1860;
  undefined8 local_1858;
  float *local_1850;
  undefined8 local_1848;
  undefined8 local_1840;
  undefined8 local_1838;
  undefined4 local_1830;
  Allocator *local_1828;
  undefined4 local_1820;
  undefined4 local_181c;
  undefined4 local_1818;
  undefined4 local_1814;
  undefined4 local_1810;
  undefined8 local_1808;
  float *local_1800;
  undefined8 local_17f8;
  undefined8 local_17f0;
  undefined8 local_17e8;
  undefined4 local_17e0;
  Allocator *local_17d8;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined4 local_17c0;
  undefined8 local_17b8;
  float *local_17b0;
  int local_17a4;
  const_reference local_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  int local_1774;
  undefined8 local_1770;
  undefined8 local_1768;
  undefined8 local_1760;
  undefined4 local_1758;
  Allocator *local_1750;
  undefined4 local_1748;
  undefined4 local_1744;
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined8 local_1730;
  undefined1 (*local_1728) [16];
  undefined8 local_1720;
  undefined8 local_1718;
  undefined8 local_1710;
  undefined4 local_1708;
  Allocator *local_1700;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  undefined8 local_16e0;
  float *local_16d8;
  int local_16cc;
  const_reference local_16c8;
  ulong local_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  int local_168c;
  undefined8 local_1688;
  undefined8 local_1680;
  undefined8 local_1678;
  undefined4 local_1670;
  Allocator *local_1668;
  undefined4 local_1660;
  undefined4 local_165c;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined4 local_1650;
  undefined8 local_1648;
  undefined1 (*local_1640) [16];
  undefined8 local_1638;
  undefined8 local_1630;
  undefined8 local_1628;
  undefined4 local_1620;
  Allocator *local_1618;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined4 local_1604;
  undefined4 local_1600;
  undefined8 local_15f8;
  float *local_15f0;
  undefined8 local_15e8;
  undefined8 local_15e0;
  undefined8 local_15d8;
  undefined4 local_15d0;
  Allocator *local_15c8;
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined8 local_15a8;
  float *local_15a0;
  int local_1594;
  const_reference local_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  int local_1564;
  undefined8 local_1560;
  undefined8 local_1558;
  undefined8 local_1550;
  undefined4 local_1548;
  Allocator *local_1540;
  undefined4 local_1538;
  undefined4 local_1534;
  undefined4 local_1530;
  undefined4 local_152c;
  undefined4 local_1528;
  undefined8 local_1520;
  undefined1 (*local_1518) [16];
  undefined8 local_1510;
  undefined8 local_1508;
  undefined8 local_1500;
  undefined4 local_14f8;
  Allocator *local_14f0;
  undefined4 local_14e8;
  undefined4 local_14e4;
  undefined4 local_14e0;
  undefined4 local_14dc;
  undefined4 local_14d8;
  undefined8 local_14d0;
  float *local_14c8;
  int local_14bc;
  const_reference local_14b8;
  ulong local_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  int local_1484;
  undefined8 local_1480;
  undefined8 local_1478;
  undefined8 local_1470;
  undefined4 local_1468;
  Allocator *local_1460;
  undefined4 local_1458;
  undefined4 local_1454;
  undefined4 local_1450;
  undefined4 local_144c;
  undefined4 local_1448;
  undefined8 local_1440;
  undefined1 (*local_1438) [16];
  undefined8 local_1430;
  undefined8 local_1428;
  undefined8 local_1420;
  undefined4 local_1418;
  Allocator *local_1410;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined8 local_13f0;
  float *local_13e8;
  undefined8 local_13d0;
  undefined8 local_13c8;
  undefined8 local_13c0;
  undefined4 local_13b8;
  Allocator *local_13b0;
  undefined4 local_13a8;
  undefined4 local_13a4;
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined8 local_1390;
  float *local_1388;
  int local_137c;
  const_reference local_1378;
  reference local_1370;
  int local_1368;
  int local_1364;
  int local_1360;
  int local_135c;
  int local_1358;
  int local_1354;
  const_reference local_1350;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1340;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1338;
  int local_1324;
  reference local_1320;
  undefined1 local_1315;
  int local_1314;
  const_reference local_1310;
  undefined8 *local_1308;
  undefined1 local_12fd;
  int local_12fc;
  const_reference local_12f8;
  undefined8 *local_12f0;
  undefined1 local_12e5;
  int local_12e4;
  const_reference local_12e0;
  undefined8 *local_12d8;
  undefined1 local_12cd;
  int local_12cc;
  const_reference local_12c8;
  undefined8 *local_12c0;
  undefined1 local_12b5;
  int local_12b4;
  const_reference local_12b0;
  undefined8 *local_12a8;
  undefined1 local_129d;
  int local_129c;
  const_reference local_1298;
  undefined8 *local_1290;
  undefined1 local_1285;
  int local_1284;
  const_reference local_1280;
  undefined8 *local_1278;
  undefined1 local_126d;
  int local_126c;
  const_reference local_1268;
  undefined8 *local_1260;
  undefined1 local_1255;
  int local_1254;
  const_reference local_1250;
  undefined8 *local_1248;
  undefined1 local_123d;
  int local_123c;
  const_reference local_1238;
  undefined8 *local_1230;
  undefined1 local_1225;
  int local_1224;
  const_reference local_1220;
  undefined8 *local_1218;
  undefined1 local_120d;
  int local_120c;
  const_reference local_1208;
  undefined8 *local_1200;
  undefined8 *local_11f8;
  undefined8 *local_11f0;
  undefined8 *local_11e8;
  undefined8 *local_11e0;
  undefined8 *local_11d8;
  undefined8 *local_11d0;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  undefined8 *local_1138;
  undefined8 *local_1128;
  undefined8 *local_1118;
  undefined8 *local_1108;
  undefined8 *local_10f8;
  undefined8 *local_10e8;
  undefined8 *local_10d8;
  undefined8 *local_10c8;
  undefined8 *local_10b8;
  undefined8 *local_10a8;
  undefined8 *local_1098;
  undefined8 *local_1088;
  undefined8 *local_1078;
  undefined8 *local_1068;
  undefined8 *local_1058;
  undefined8 *local_1048;
  undefined8 *local_1038;
  undefined8 *local_1028;
  undefined8 *local_1018;
  undefined8 *local_1008;
  undefined1 local_ff5;
  int local_ff4;
  reference local_ff0;
  undefined8 *local_fe8;
  undefined1 local_fd5;
  int local_fd4;
  reference local_fd0;
  undefined8 *local_fc8;
  undefined1 local_fb5;
  int local_fb4;
  reference local_fb0;
  undefined8 *local_fa8;
  undefined1 local_f95;
  int local_f94;
  reference local_f90;
  undefined8 *local_f88;
  undefined1 local_f75;
  int local_f74;
  reference local_f70;
  undefined8 *local_f68;
  undefined1 local_f55;
  int local_f54;
  reference local_f50;
  undefined8 *local_f48;
  undefined1 local_f35;
  int local_f34;
  reference local_f30;
  undefined8 *local_f28;
  undefined1 local_f15;
  int local_f14;
  reference local_f10;
  undefined8 *local_f08;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  undefined8 *local_ee8;
  undefined8 *local_ee0;
  undefined8 *local_ed8;
  undefined8 *local_ed0;
  undefined8 *local_ec8;
  undefined8 *local_ec0;
  undefined1 (*local_eb8) [16];
  undefined1 (*local_eb0) [16];
  undefined1 (*local_ea8) [16];
  undefined1 (*local_ea0) [16];
  float *local_e98;
  float *local_e90;
  float *local_e88;
  float *local_e80;
  float *local_e78;
  undefined1 (*local_e70) [16];
  float *local_e68;
  float *local_e60;
  float *local_e58;
  undefined1 (*local_e50) [16];
  float *local_e48;
  float *local_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined1 (*local_d80) [16];
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined1 (*local_d60) [16];
  undefined8 local_d58;
  undefined8 uStack_d50;
  float *local_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  float *local_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined1 (*local_d00) [16];
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined1 (*local_ce0) [16];
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined1 (*local_cc0) [16];
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined1 (*local_ca0) [16];
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  size_type local_c18;
  long *local_c10;
  undefined8 local_c08;
  long *local_c00;
  undefined8 local_bf8;
  long *local_bf0;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bd8;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_bb8;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  reference local_b48;
  Allocator *local_b40;
  int local_b34;
  size_t local_b30;
  undefined1 (*local_b28) [16];
  int local_b1c;
  int local_b18;
  int local_b14;
  undefined8 *local_b10;
  Allocator *local_b08;
  int local_afc;
  size_t local_af8;
  undefined1 (*local_af0) [16];
  int local_ae4;
  int local_ae0;
  int local_adc;
  undefined8 *local_ad8;
  Allocator *local_ad0;
  int local_ac4;
  size_t local_ac0;
  undefined1 (*local_ab8) [16];
  int local_aac;
  int local_aa8;
  int local_aa4;
  undefined8 *local_aa0;
  Allocator *local_a98;
  int local_a8c;
  size_t local_a88;
  undefined1 (*local_a80) [16];
  int local_a74;
  int local_a70;
  int local_a6c;
  undefined8 *local_a68;
  Allocator *local_a60;
  int local_a54;
  size_t local_a50;
  float *local_a48;
  int local_a3c;
  int local_a38;
  int local_a34;
  undefined8 *local_a30;
  Allocator *local_a28;
  int local_a1c;
  size_t local_a18;
  float *local_a10;
  int local_a04;
  int local_a00;
  int local_9fc;
  undefined8 *local_9f8;
  Allocator *local_9f0;
  int local_9e4;
  size_t local_9e0;
  undefined1 (*local_9d8) [16];
  int local_9cc;
  int local_9c8;
  int local_9c4;
  undefined8 *local_9c0;
  Allocator *local_9b8;
  int local_9ac;
  size_t local_9a8;
  undefined1 (*local_9a0) [16];
  int local_994;
  int local_990;
  int local_98c;
  undefined8 *local_988;
  Allocator *local_980;
  int local_974;
  size_t local_970;
  float *local_968;
  int local_95c;
  int local_958;
  int local_954;
  undefined8 *local_950;
  Allocator *local_948;
  int local_93c;
  size_t local_938;
  float *local_930;
  int local_924;
  int local_920;
  int local_91c;
  undefined8 *local_918;
  Allocator *local_910;
  int local_904;
  size_t local_900;
  float *local_8f8;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  undefined8 *local_8e0;
  Allocator *local_8d8;
  int local_8cc;
  size_t local_8c8;
  float *local_8c0;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  undefined8 *local_8a8;
  Allocator *local_8a0;
  int local_894;
  size_t local_890;
  float *local_888;
  int local_87c;
  int local_878;
  int local_874;
  undefined8 *local_870;
  Allocator *local_868;
  int local_85c;
  size_t local_858;
  float *local_850;
  int local_844;
  int local_840;
  int local_83c;
  undefined8 *local_838;
  Allocator *local_830;
  int local_824;
  size_t local_820;
  float *local_818;
  int local_80c;
  int local_808;
  int local_804;
  undefined8 *local_800;
  Allocator *local_7f8;
  int local_7ec;
  size_t local_7e8;
  float *local_7e0;
  int local_7d4;
  int local_7d0;
  int local_7cc;
  undefined8 *local_7c8;
  Allocator *local_7c0;
  int local_7b4;
  size_t local_7b0;
  float *local_7a8;
  int local_79c;
  int local_798;
  int local_794;
  undefined8 *local_790;
  Allocator *local_788;
  int local_77c;
  size_t local_778;
  undefined1 (*local_770) [16];
  int local_764;
  int local_760;
  int local_75c;
  undefined8 *local_758;
  Allocator *local_750;
  int local_744;
  size_t local_740;
  undefined1 (*local_738) [16];
  int local_72c;
  int local_728;
  int local_724;
  undefined8 *local_720;
  Allocator *local_718;
  int local_70c;
  size_t local_708;
  undefined1 (*local_700) [16];
  int local_6f4;
  int local_6f0;
  int local_6ec;
  undefined8 *local_6e8;
  undefined4 local_6dc;
  long local_6d8;
  undefined4 local_6cc;
  long local_6c8;
  undefined4 local_6bc;
  long local_6b8;
  undefined4 local_6ac;
  long local_6a8;
  undefined4 local_69c;
  long local_698;
  undefined4 local_68c;
  long local_688;
  undefined4 local_67c;
  long local_678;
  undefined4 local_66c;
  long local_668;
  undefined4 local_65c;
  long local_658;
  undefined4 local_64c;
  long local_648;
  undefined4 local_63c;
  long local_638;
  undefined4 local_62c;
  long local_628;
  undefined4 local_61c;
  long local_618;
  undefined4 local_60c;
  long local_608;
  undefined4 local_5fc;
  long local_5f8;
  undefined4 local_5ec;
  long local_5e8;
  undefined4 local_5dc;
  long local_5d8;
  undefined4 local_5cc;
  long local_5c8;
  undefined4 local_5bc;
  long local_5b8;
  undefined4 local_5ac;
  long local_5a8;
  undefined8 *local_508;
  undefined8 *local_4e8;
  undefined8 *local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined8 *local_468;
  undefined8 *local_448;
  undefined8 *local_428;
  undefined8 *local_408;
  undefined8 *local_3e8;
  undefined8 *local_3c8;
  undefined8 *local_3a8;
  undefined8 *local_388;
  undefined8 *local_368;
  undefined8 *local_348;
  undefined8 *local_328;
  undefined8 *local_308;
  undefined8 *local_2e8;
  undefined8 *local_2c8;
  undefined8 *local_2a8;
  
  local_1340 = in_RDX;
  local_1338 = in_RSI;
  local_1350 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1354 = local_1350->w;
  local_1358 = local_1350->h;
  local_135c = local_1350->d;
  local_1360 = local_1350->c;
  local_1364 = local_1350->elempack;
  local_1368 = local_1354 * local_1358 * local_135c * local_1364;
  local_1370 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1340,0);
  Mat::create_like(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0);
  local_1320 = local_1370;
  bVar11 = true;
  if (local_1370->data != (void *)0x0) {
    local_b48 = local_1370;
    bVar11 = local_1370->cstep * (long)local_1370->c == 0;
  }
  if (bVar11) {
    local_1324 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xd0) == 0) {
      local_1378 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1338,1);
      for (local_137c = 0; local_137c < local_1360; local_137c = local_137c + 1) {
        local_1200 = &local_13d0;
        local_954 = local_1350->w;
        local_958 = local_1350->h;
        local_95c = local_1350->d;
        local_968 = (float *)((long)local_1350->data +
                             local_1350->cstep * (long)local_137c * local_1350->elemsize);
        local_970 = local_1350->elemsize;
        local_974 = local_1350->elempack;
        local_980 = local_1350->allocator;
        local_950 = &local_13d0;
        local_628 = (long)local_954 * (long)local_958 * local_970;
        local_11a0 = &local_13d0;
        local_1138 = &local_13d0;
        local_1218 = &local_1430;
        local_91c = local_1378->w;
        local_920 = local_1378->h;
        local_924 = local_1378->d;
        local_930 = (float *)((long)local_1378->data +
                             local_1378->cstep * (long)local_137c * local_1378->elemsize);
        local_938 = local_1378->elemsize;
        local_93c = local_1378->elempack;
        local_948 = local_1378->allocator;
        local_918 = &local_1430;
        local_638 = (long)local_91c * (long)local_920 * local_938;
        local_11a8 = &local_1430;
        local_1128 = &local_1430;
        local_f08 = &local_1480;
        local_b14 = local_1370->w;
        local_b18 = local_1370->h;
        local_b1c = local_1370->d;
        local_b28 = (undefined1 (*) [16])
                    ((long)local_1370->data +
                    local_1370->cstep * (long)local_137c * local_1370->elemsize);
        local_b30 = local_1370->elemsize;
        local_b34 = local_1370->elempack;
        local_b40 = local_1370->allocator;
        local_b10 = &local_1480;
        local_5a8 = (long)local_b14 * (long)local_b18 * local_b30;
        local_1398 = 0;
        local_139c = 0;
        local_13a0 = 0;
        local_13a4 = 0;
        local_13b8 = 0;
        local_13c0 = 0;
        local_13c8 = 0;
        local_13d0 = 0;
        local_13f8 = 0;
        local_13fc = 0;
        local_1400 = 0;
        local_1404 = 0;
        local_1418 = 0;
        local_1420 = 0;
        local_1428 = 0;
        local_1430 = 0;
        local_5ac = 0x10;
        local_62c = 0x10;
        local_63c = 0x10;
        local_f10 = local_1370;
        local_f14 = local_137c;
        local_f15 = 1;
        local_1208 = local_1350;
        local_120c = local_137c;
        local_120d = 1;
        local_1224 = local_137c;
        local_1225 = 1;
        local_1390 = 0;
        local_13a8 = 0;
        local_13f0 = 0;
        local_1408 = 0;
        local_ec0 = &local_1480;
        local_1118 = &local_1480;
        local_1480 = 0;
        local_1470 = 0;
        local_1468 = 0;
        local_1458 = 0;
        local_1454 = 0;
        local_1450 = 0;
        local_144c = 0;
        local_1448 = 0;
        local_1440 = 0;
        local_1478 = 0;
        local_1438 = local_b28;
        local_13e8 = local_930;
        local_1388 = local_968;
        for (local_1484 = 0; local_1484 + 3 < local_1368; local_1484 = local_1484 + 4) {
          local_e40 = local_1388;
          uVar1 = *(undefined8 *)local_1388;
          uVar2 = *(undefined8 *)(local_1388 + 2);
          local_e48 = local_13e8;
          local_14a8 = *(undefined8 *)local_13e8;
          uStack_14a0 = *(undefined8 *)(local_13e8 + 2);
          local_da8._0_4_ = (float)uVar1;
          local_da8._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_da0._0_4_ = (float)uVar2;
          uStack_da0._4_4_ = (float)((ulong)uVar2 >> 0x20);
          local_db8._0_4_ = (float)local_14a8;
          local_db8._4_4_ = (float)((ulong)local_14a8 >> 0x20);
          uStack_db0._0_4_ = (float)uStack_14a0;
          uStack_db0._4_4_ = (float)((ulong)uStack_14a0 >> 0x20);
          local_1498 = CONCAT44(local_da8._4_4_ * local_db8._4_4_,
                                (float)local_da8 * (float)local_db8);
          uStack_1490 = CONCAT44(uStack_da0._4_4_ * uStack_db0._4_4_,
                                 (float)uStack_da0 * (float)uStack_db0);
          local_ca0 = local_1438;
          local_cb8 = local_1498;
          uStack_cb0 = uStack_1490;
          auVar12._8_8_ = uStack_1490;
          auVar12._0_8_ = local_1498;
          *local_1438 = auVar12;
          local_1388 = local_1388 + 4;
          local_13e8 = local_13e8 + 4;
          local_1438 = local_1438 + 1;
          local_db8 = local_14a8;
          uStack_db0 = uStack_14a0;
          local_da8 = uVar1;
          uStack_da0 = uVar2;
        }
        for (; local_1484 < local_1368; local_1484 = local_1484 + 1) {
          *(float *)*local_1438 = *local_1388 * *local_13e8;
          local_1388 = local_1388 + 1;
          local_13e8 = local_13e8 + 1;
          local_1438 = (undefined1 (*) [16])(*local_1438 + 4);
        }
        local_1220 = local_1378;
        local_2e8 = local_1118;
        local_2c8 = local_1128;
        local_2a8 = local_1138;
        local_1460 = local_b40;
        local_1410 = local_948;
        local_13b0 = local_980;
      }
      for (local_14b0 = 2; uVar8 = local_14b0,
          sVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1338),
          uVar8 < sVar9; local_14b0 = local_14b0 + 1) {
        local_14b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_1338,local_14b0);
        for (local_14bc = 0; local_14bc < local_1360; local_14bc = local_14bc + 1) {
          local_1230 = &local_1510;
          local_8e4 = local_14b8->w;
          local_8e8 = local_14b8->h;
          local_8ec = local_14b8->d;
          local_8f8 = (float *)((long)local_14b8->data +
                               local_14b8->cstep * (long)local_14bc * local_14b8->elemsize);
          local_900 = local_14b8->elemsize;
          local_904 = local_14b8->elempack;
          local_910 = local_14b8->allocator;
          local_8e0 = &local_1510;
          local_648 = (long)local_8e4 * (long)local_8e8 * local_900;
          local_11b0 = &local_1510;
          local_1108 = &local_1510;
          local_f28 = &local_1560;
          local_adc = local_1370->w;
          local_ae0 = local_1370->h;
          local_ae4 = local_1370->d;
          local_af0 = (undefined1 (*) [16])
                      ((long)local_1370->data +
                      local_1370->cstep * (long)local_14bc * local_1370->elemsize);
          local_af8 = local_1370->elemsize;
          local_afc = local_1370->elempack;
          local_b08 = local_1370->allocator;
          local_ad8 = &local_1560;
          local_5b8 = (long)local_adc * (long)local_ae0 * local_af8;
          local_14d8 = 0;
          local_14dc = 0;
          local_14e0 = 0;
          local_14e4 = 0;
          local_14f8 = 0;
          local_1500 = 0;
          local_1508 = 0;
          local_1510 = 0;
          local_5bc = 0x10;
          local_64c = 0x10;
          local_f30 = local_1370;
          local_f34 = local_14bc;
          local_f35 = 1;
          local_123c = local_14bc;
          local_123d = 1;
          local_14d0 = 0;
          local_14e8 = 0;
          local_ec8 = &local_1560;
          local_10f8 = &local_1560;
          local_1560 = 0;
          local_1550 = 0;
          local_1548 = 0;
          local_1538 = 0;
          local_1534 = 0;
          local_1530 = 0;
          local_152c = 0;
          local_1528 = 0;
          local_1520 = 0;
          local_1558 = 0;
          local_1518 = local_af0;
          local_14c8 = local_8f8;
          for (local_1564 = 0; local_1564 + 3 < local_1368; local_1564 = local_1564 + 4) {
            local_e50 = local_1518;
            uVar1 = *(undefined8 *)*local_1518;
            uVar2 = *(undefined8 *)(*local_1518 + 8);
            local_e58 = local_14c8;
            local_1588 = *(undefined8 *)local_14c8;
            uStack_1580 = *(undefined8 *)(local_14c8 + 2);
            local_dc8._0_4_ = (float)uVar1;
            local_dc8._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_dc0._0_4_ = (float)uVar2;
            uStack_dc0._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_dd8._0_4_ = (float)local_1588;
            local_dd8._4_4_ = (float)((ulong)local_1588 >> 0x20);
            uStack_dd0._0_4_ = (float)uStack_1580;
            uStack_dd0._4_4_ = (float)((ulong)uStack_1580 >> 0x20);
            local_1578 = CONCAT44(local_dc8._4_4_ * local_dd8._4_4_,
                                  (float)local_dc8 * (float)local_dd8);
            uStack_1570 = CONCAT44(uStack_dc0._4_4_ * uStack_dd0._4_4_,
                                   (float)uStack_dc0 * (float)uStack_dd0);
            local_cc0 = local_1518;
            local_cd8 = local_1578;
            uStack_cd0 = uStack_1570;
            auVar7._8_8_ = uStack_1570;
            auVar7._0_8_ = local_1578;
            *local_1518 = auVar7;
            local_14c8 = local_14c8 + 4;
            local_1518 = local_1518 + 1;
            local_dd8 = local_1588;
            uStack_dd0 = uStack_1580;
            local_dc8 = uVar1;
            uStack_dc0 = uVar2;
          }
          for (; local_1564 < local_1368; local_1564 = local_1564 + 1) {
            *(float *)*local_1518 = *local_14c8 * *(float *)*local_1518;
            local_14c8 = local_14c8 + 1;
            local_1518 = (undefined1 (*) [16])(*local_1518 + 4);
          }
          local_1238 = local_14b8;
          local_328 = local_10f8;
          local_308 = local_1108;
          local_1540 = local_b08;
          local_14f0 = local_910;
        }
      }
    }
    if (*(int *)(in_RDI + 0xd0) == 1) {
      if (*(int *)(in_RDI + 0x104) == 0) {
        local_1590 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1338,1);
        for (local_1594 = 0; local_1594 < local_1360; local_1594 = local_1594 + 1) {
          local_1248 = &local_15e8;
          local_8ac = local_1350->w;
          local_8b0 = local_1350->h;
          local_8b4 = local_1350->d;
          local_8c0 = (float *)((long)local_1350->data +
                               local_1350->cstep * (long)local_1594 * local_1350->elemsize);
          local_8c8 = local_1350->elemsize;
          local_8cc = local_1350->elempack;
          local_8d8 = local_1350->allocator;
          local_8a8 = &local_15e8;
          local_658 = (long)local_8ac * (long)local_8b0 * local_8c8;
          local_11b8 = &local_15e8;
          local_10e8 = &local_15e8;
          local_1260 = &local_1638;
          local_874 = local_1590->w;
          local_878 = local_1590->h;
          local_87c = local_1590->d;
          local_888 = (float *)((long)local_1590->data +
                               local_1590->cstep * (long)local_1594 * local_1590->elemsize);
          local_890 = local_1590->elemsize;
          local_894 = local_1590->elempack;
          local_8a0 = local_1590->allocator;
          local_870 = &local_1638;
          local_668 = (long)local_874 * (long)local_878 * local_890;
          local_11c0 = &local_1638;
          local_10d8 = &local_1638;
          local_15b0 = 0;
          local_15b4 = 0;
          local_15b8 = 0;
          local_15bc = 0;
          local_15d0 = 0;
          local_15d8 = 0;
          local_15e0 = 0;
          local_15e8 = 0;
          local_65c = 0x10;
          local_66c = 0x10;
          local_1250 = local_1350;
          local_1254 = local_1594;
          local_1255 = 1;
          local_126c = local_1594;
          local_126d = 1;
          local_15a8 = 0;
          local_15c0 = 0;
          local_1638 = 0;
          local_1628 = 0;
          local_1620 = 0;
          local_160c = 0;
          local_1608 = 0;
          local_1604 = 0;
          local_1600 = 0;
          local_1630 = 0;
          local_f48 = &local_1688;
          local_aa4 = local_1370->w;
          local_aa8 = local_1370->h;
          local_aac = local_1370->d;
          local_ab8 = (undefined1 (*) [16])
                      ((long)local_1370->data +
                      local_1370->cstep * (long)local_1594 * local_1370->elemsize);
          local_ac0 = local_1370->elemsize;
          local_ac4 = local_1370->elempack;
          local_ad0 = local_1370->allocator;
          local_aa0 = &local_1688;
          local_5c8 = (long)local_aa4 * (long)local_aa8 * local_ac0;
          local_5cc = 0x10;
          local_f50 = local_1370;
          local_f54 = local_1594;
          local_f55 = 1;
          local_15f8 = 0;
          local_1610 = 0;
          local_ed0 = &local_1688;
          local_10c8 = &local_1688;
          local_1688 = 0;
          local_1678 = 0;
          local_1670 = 0;
          local_1660 = 0;
          local_165c = 0;
          local_1658 = 0;
          local_1654 = 0;
          local_1650 = 0;
          local_1648 = 0;
          local_1680 = 0;
          local_1640 = local_ab8;
          local_15f0 = local_888;
          local_15a0 = local_8c0;
          for (local_168c = 0; local_168c + 3 < local_1368; local_168c = local_168c + 4) {
            local_e60 = local_15a0;
            uVar1 = *(undefined8 *)local_15a0;
            uVar2 = *(undefined8 *)(local_15a0 + 2);
            local_e68 = local_15f0;
            local_16b8 = *(undefined8 *)local_15f0;
            uStack_16b0 = *(undefined8 *)(local_15f0 + 2);
            local_c28._0_4_ = (float)uVar1;
            local_c28._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_c20._0_4_ = (float)uVar2;
            uStack_c20._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_c38._0_4_ = (float)local_16b8;
            local_c38._4_4_ = (float)((ulong)local_16b8 >> 0x20);
            uStack_c30._0_4_ = (float)uStack_16b0;
            uStack_c30._4_4_ = (float)((ulong)uStack_16b0 >> 0x20);
            local_16a8 = CONCAT44(local_c28._4_4_ + local_c38._4_4_,
                                  (float)local_c28 + (float)local_c38);
            uStack_16a0 = CONCAT44(uStack_c20._4_4_ + uStack_c30._4_4_,
                                   (float)uStack_c20 + (float)uStack_c30);
            local_ce0 = local_1640;
            local_cf8 = local_16a8;
            uStack_cf0 = uStack_16a0;
            auVar6._8_8_ = uStack_16a0;
            auVar6._0_8_ = local_16a8;
            *local_1640 = auVar6;
            local_15a0 = local_15a0 + 4;
            local_15f0 = local_15f0 + 4;
            local_1640 = local_1640 + 1;
            local_c38 = local_16b8;
            uStack_c30 = uStack_16b0;
            local_c28 = uVar1;
            uStack_c20 = uVar2;
          }
          for (; local_168c < local_1368; local_168c = local_168c + 1) {
            *(float *)*local_1640 = *local_15a0 + *local_15f0;
            local_15a0 = local_15a0 + 1;
            local_15f0 = local_15f0 + 1;
            local_1640 = (undefined1 (*) [16])(*local_1640 + 4);
          }
          local_1268 = local_1590;
          local_388 = local_10c8;
          local_368 = local_10d8;
          local_348 = local_10e8;
          local_1668 = local_ad0;
          local_1618 = local_8a0;
          local_15c8 = local_8d8;
        }
        for (local_16c0 = 2; uVar8 = local_16c0,
            sVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1338),
            uVar8 < sVar9; local_16c0 = local_16c0 + 1) {
          local_16c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_1338,local_16c0);
          for (local_16cc = 0; local_16cc < local_1360; local_16cc = local_16cc + 1) {
            local_1278 = &local_1720;
            local_83c = local_16c8->w;
            local_840 = local_16c8->h;
            local_844 = local_16c8->d;
            local_850 = (float *)((long)local_16c8->data +
                                 local_16c8->cstep * (long)local_16cc * local_16c8->elemsize);
            local_858 = local_16c8->elemsize;
            local_85c = local_16c8->elempack;
            local_868 = local_16c8->allocator;
            local_838 = &local_1720;
            local_678 = (long)local_83c * (long)local_840 * local_858;
            local_11c8 = &local_1720;
            local_10b8 = &local_1720;
            local_67c = 0x10;
            local_1284 = local_16cc;
            local_1285 = 1;
            local_1720 = 0;
            local_1710 = 0;
            local_1708 = 0;
            local_16f4 = 0;
            local_16f0 = 0;
            local_16ec = 0;
            local_16e8 = 0;
            local_1718 = 0;
            local_f68 = &local_1770;
            local_a6c = local_1370->w;
            local_a70 = local_1370->h;
            local_a74 = local_1370->d;
            local_a80 = (undefined1 (*) [16])
                        ((long)local_1370->data +
                        local_1370->cstep * (long)local_16cc * local_1370->elemsize);
            local_a88 = local_1370->elemsize;
            local_a8c = local_1370->elempack;
            local_a98 = local_1370->allocator;
            local_a68 = &local_1770;
            local_5d8 = (long)local_a6c * (long)local_a70 * local_a88;
            local_5dc = 0x10;
            local_f70 = local_1370;
            local_f74 = local_16cc;
            local_f75 = 1;
            local_16e0 = 0;
            local_16f8 = 0;
            local_ed8 = &local_1770;
            local_10a8 = &local_1770;
            local_1770 = 0;
            local_1760 = 0;
            local_1758 = 0;
            local_1748 = 0;
            local_1744 = 0;
            local_1740 = 0;
            local_173c = 0;
            local_1738 = 0;
            local_1730 = 0;
            local_1768 = 0;
            local_1728 = local_a80;
            local_16d8 = local_850;
            for (local_1774 = 0; local_1774 + 3 < local_1368; local_1774 = local_1774 + 4) {
              local_e70 = local_1728;
              uVar1 = *(undefined8 *)*local_1728;
              uVar2 = *(undefined8 *)(*local_1728 + 8);
              local_e78 = local_16d8;
              local_1798 = *(undefined8 *)local_16d8;
              uStack_1790 = *(undefined8 *)(local_16d8 + 2);
              local_c48._0_4_ = (float)uVar1;
              local_c48._4_4_ = (float)((ulong)uVar1 >> 0x20);
              uStack_c40._0_4_ = (float)uVar2;
              uStack_c40._4_4_ = (float)((ulong)uVar2 >> 0x20);
              local_c58._0_4_ = (float)local_1798;
              local_c58._4_4_ = (float)((ulong)local_1798 >> 0x20);
              uStack_c50._0_4_ = (float)uStack_1790;
              uStack_c50._4_4_ = (float)((ulong)uStack_1790 >> 0x20);
              local_1788 = CONCAT44(local_c48._4_4_ + local_c58._4_4_,
                                    (float)local_c48 + (float)local_c58);
              uStack_1780 = CONCAT44(uStack_c40._4_4_ + uStack_c50._4_4_,
                                     (float)uStack_c40 + (float)uStack_c50);
              local_d00 = local_1728;
              local_d18 = local_1788;
              uStack_d10 = uStack_1780;
              auVar5._8_8_ = uStack_1780;
              auVar5._0_8_ = local_1788;
              *local_1728 = auVar5;
              local_16d8 = local_16d8 + 4;
              local_1728 = local_1728 + 1;
              local_c58 = local_1798;
              uStack_c50 = uStack_1790;
              local_c48 = uVar1;
              uStack_c40 = uVar2;
            }
            for (; local_1774 < local_1368; local_1774 = local_1774 + 1) {
              *(float *)*local_1728 = *local_16d8 + *(float *)*local_1728;
              local_16d8 = local_16d8 + 1;
              local_1728 = (undefined1 (*) [16])(*local_1728 + 4);
            }
            local_1280 = local_16c8;
            local_3c8 = local_10a8;
            local_3a8 = local_10b8;
            local_1750 = local_a98;
            local_1700 = local_868;
          }
        }
      }
      else {
        local_17a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1338,1);
        for (local_17a4 = 0; local_17a4 < local_1360; local_17a4 = local_17a4 + 1) {
          local_1290 = &local_17f8;
          local_804 = local_1350->w;
          local_808 = local_1350->h;
          local_80c = local_1350->d;
          local_818 = (float *)((long)local_1350->data +
                               local_1350->cstep * (long)local_17a4 * local_1350->elemsize);
          local_820 = local_1350->elemsize;
          local_824 = local_1350->elempack;
          local_830 = local_1350->allocator;
          local_800 = &local_17f8;
          local_688 = (long)local_804 * (long)local_808 * local_820;
          local_11d0 = &local_17f8;
          local_1098 = &local_17f8;
          local_12a8 = &local_1848;
          local_7cc = local_17a0->w;
          local_7d0 = local_17a0->h;
          local_7d4 = local_17a0->d;
          local_7e0 = (float *)((long)local_17a0->data +
                               local_17a0->cstep * (long)local_17a4 * local_17a0->elemsize);
          local_7e8 = local_17a0->elemsize;
          local_7ec = local_17a0->elempack;
          local_7f8 = local_17a0->allocator;
          local_7c8 = &local_1848;
          local_698 = (long)local_7cc * (long)local_7d0 * local_7e8;
          local_11d8 = &local_1848;
          local_1088 = &local_1848;
          local_17c0 = 0;
          local_17c4 = 0;
          local_17c8 = 0;
          local_17cc = 0;
          local_17e0 = 0;
          local_17e8 = 0;
          local_17f0 = 0;
          local_17f8 = 0;
          local_68c = 0x10;
          local_69c = 0x10;
          local_1298 = local_1350;
          local_129c = local_17a4;
          local_129d = 1;
          local_12b4 = local_17a4;
          local_12b5 = 1;
          local_17b8 = 0;
          local_17d0 = 0;
          local_1848 = 0;
          local_1838 = 0;
          local_1830 = 0;
          local_181c = 0;
          local_1818 = 0;
          local_1814 = 0;
          local_1810 = 0;
          local_1840 = 0;
          local_f88 = &local_1898;
          local_a34 = local_1370->w;
          local_a38 = local_1370->h;
          local_a3c = local_1370->d;
          local_a48 = (float *)((long)local_1370->data +
                               local_1370->cstep * (long)local_17a4 * local_1370->elemsize);
          local_a50 = local_1370->elemsize;
          local_a54 = local_1370->elempack;
          local_a60 = local_1370->allocator;
          local_a30 = &local_1898;
          local_5e8 = (long)local_a34 * (long)local_a38 * local_a50;
          local_5ec = 0x10;
          local_f90 = local_1370;
          local_f94 = local_17a4;
          local_f95 = 1;
          local_1808 = 0;
          local_1820 = 0;
          local_ee0 = &local_1898;
          local_1078 = &local_1898;
          local_1898 = 0;
          local_1888 = 0;
          local_1880 = 0;
          local_1870 = 0;
          local_186c = 0;
          local_1868 = 0;
          local_1864 = 0;
          local_1860 = 0;
          local_1858 = 0;
          local_1890 = 0;
          local_c00 = (long *)(in_RDI + 0xd8);
          local_bf8 = 0;
          local_189c = *(float *)*local_c00;
          local_c08 = 1;
          local_18a0 = *(float *)(*local_c00 + 4);
          local_18b8 = CONCAT44(local_189c,local_189c);
          uStack_18b0 = CONCAT44(local_189c,local_189c);
          local_18c8 = CONCAT44(local_18a0,local_18a0);
          uStack_18c0 = CONCAT44(local_18a0,local_18a0);
          local_1850 = local_a48;
          local_1800 = local_7e0;
          local_17b0 = local_818;
          for (local_18a4 = 0; local_18a4 + 3 < local_1368; local_18a4 = local_18a4 + 4) {
            local_e80 = local_17b0;
            uVar1 = *(undefined8 *)local_17b0;
            uVar2 = *(undefined8 *)(local_17b0 + 2);
            local_e88 = local_1800;
            uVar3 = *(undefined8 *)local_1800;
            uVar4 = *(undefined8 *)(local_1800 + 2);
            local_de8._0_4_ = (float)uVar1;
            local_de8._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_de0._0_4_ = (float)uVar2;
            uStack_de0._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_18d8 = CONCAT44(local_de8._4_4_ * local_189c,(float)local_de8 * local_189c);
            uStack_18d0 = CONCAT44(uStack_de0._4_4_ * local_189c,(float)uStack_de0 * local_189c);
            local_e08._0_4_ = (float)uVar3;
            local_e08._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_e00._0_4_ = (float)uVar4;
            uStack_e00._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_18e8 = CONCAT44(local_e08._4_4_ * local_18a0,(float)local_e08 * local_18a0);
            uStack_18e0 = CONCAT44(uStack_e00._4_4_ * local_18a0,(float)uStack_e00 * local_18a0);
            local_c68 = local_18e8;
            uStack_c60 = uStack_18e0;
            local_c78 = local_18d8;
            uStack_c70 = uStack_18d0;
            local_18d8 = CONCAT44(local_e08._4_4_ * local_18a0 + local_de8._4_4_ * local_189c,
                                  (float)local_e08 * local_18a0 + (float)local_de8 * local_189c);
            uStack_18d0 = CONCAT44(uStack_e00._4_4_ * local_18a0 + uStack_de0._4_4_ * local_189c,
                                   (float)uStack_e00 * local_18a0 + (float)uStack_de0 * local_189c);
            local_d20 = local_1850;
            local_d38 = local_18d8;
            uStack_d30 = uStack_18d0;
            *(undefined8 *)local_1850 = local_18d8;
            *(undefined8 *)(local_1850 + 2) = uStack_18d0;
            local_17b0 = local_17b0 + 4;
            local_1800 = local_1800 + 4;
            local_1850 = local_1850 + 4;
            local_e18 = local_18c8;
            uStack_e10 = uStack_18c0;
            local_e08 = uVar3;
            uStack_e00 = uVar4;
            local_df8 = local_18b8;
            uStack_df0 = uStack_18b0;
            local_de8 = uVar1;
            uStack_de0 = uVar2;
          }
          for (; local_18a4 < local_1368; local_18a4 = local_18a4 + 1) {
            *local_1850 = *local_17b0 * local_189c + *local_1800 * local_18a0;
            local_17b0 = local_17b0 + 1;
            local_1800 = local_1800 + 1;
            local_1850 = local_1850 + 1;
          }
          local_12b0 = local_17a0;
          local_bf0 = local_c00;
          local_bc8 = local_18a0;
          fStack_bc4 = local_18a0;
          fStack_bc0 = local_18a0;
          fStack_bbc = local_18a0;
          local_bb8 = local_18a0;
          local_ba8 = local_189c;
          fStack_ba4 = local_189c;
          fStack_ba0 = local_189c;
          fStack_b9c = local_189c;
          local_b8c = local_189c;
          local_428 = local_1078;
          local_408 = local_1088;
          local_3e8 = local_1098;
          local_1878 = local_a60;
          local_1828 = local_7f8;
          local_17d8 = local_830;
        }
        for (local_18f0 = 2; uVar8 = local_18f0,
            sVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1338),
            uVar8 < sVar9; local_18f0 = local_18f0 + 1) {
          local_18f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_1338,local_18f0);
          for (local_18fc = 0; local_18fc < local_1360; local_18fc = local_18fc + 1) {
            local_12c0 = &local_1950;
            local_794 = local_18f8->w;
            local_798 = local_18f8->h;
            local_79c = local_18f8->d;
            local_7a8 = (float *)((long)local_18f8->data +
                                 local_18f8->cstep * (long)local_18fc * local_18f8->elemsize);
            local_7b0 = local_18f8->elemsize;
            local_7b4 = local_18f8->elempack;
            local_7c0 = local_18f8->allocator;
            local_790 = &local_1950;
            local_6a8 = (long)local_794 * (long)local_798 * local_7b0;
            local_11e0 = &local_1950;
            local_1068 = &local_1950;
            local_6ac = 0x10;
            local_12cc = local_18fc;
            local_12cd = 1;
            local_1950 = 0;
            local_1940 = 0;
            local_1938 = 0;
            local_1924 = 0;
            local_1920 = 0;
            local_191c = 0;
            local_1918 = 0;
            local_1948 = 0;
            local_fa8 = &local_19a0;
            local_9fc = local_1370->w;
            local_a00 = local_1370->h;
            local_a04 = local_1370->d;
            local_a10 = (float *)((long)local_1370->data +
                                 local_1370->cstep * (long)local_18fc * local_1370->elemsize);
            local_a18 = local_1370->elemsize;
            local_a1c = local_1370->elempack;
            local_a28 = local_1370->allocator;
            local_9f8 = &local_19a0;
            local_5f8 = (long)local_9fc * (long)local_a00 * local_a18;
            local_5fc = 0x10;
            local_fb0 = local_1370;
            local_fb4 = local_18fc;
            local_fb5 = 1;
            local_1910 = 0;
            local_1928 = 0;
            local_ee8 = &local_19a0;
            local_1058 = &local_19a0;
            local_19a0 = 0;
            local_1990 = 0;
            local_1988 = 0;
            local_1978 = 0;
            local_1974 = 0;
            local_1970 = 0;
            local_196c = 0;
            local_1968 = 0;
            local_1960 = 0;
            local_1998 = 0;
            local_c10 = (long *)(in_RDI + 0xd8);
            local_c18 = local_18f0;
            local_19a4 = *(float *)(*local_c10 + local_18f0 * 4);
            local_19b8 = CONCAT44(local_19a4,local_19a4);
            uStack_19b0 = CONCAT44(local_19a4,local_19a4);
            local_1958 = local_a10;
            local_1908 = local_7a8;
            for (local_19a8 = 0; local_19a8 + 3 < local_1368; local_19a8 = local_19a8 + 4) {
              local_e90 = local_1908;
              uVar1 = *(undefined8 *)local_1908;
              uVar2 = *(undefined8 *)(local_1908 + 2);
              local_e98 = local_1958;
              uVar3 = *(undefined8 *)local_1958;
              uVar4 = *(undefined8 *)(local_1958 + 2);
              local_e28._0_4_ = (float)uVar1;
              local_e28._4_4_ = (float)((ulong)uVar1 >> 0x20);
              uStack_e20._0_4_ = (float)uVar2;
              uStack_e20._4_4_ = (float)((ulong)uVar2 >> 0x20);
              local_19c8 = CONCAT44(local_e28._4_4_ * local_19a4,(float)local_e28 * local_19a4);
              uStack_19c0 = CONCAT44(uStack_e20._4_4_ * local_19a4,(float)uStack_e20 * local_19a4);
              local_c88 = local_19c8;
              uStack_c80 = uStack_19c0;
              local_c98._0_4_ = (float)uVar3;
              local_c98._4_4_ = (float)((ulong)uVar3 >> 0x20);
              uStack_c90._0_4_ = (float)uVar4;
              uStack_c90._4_4_ = (float)((ulong)uVar4 >> 0x20);
              local_19d8 = CONCAT44(local_e28._4_4_ * local_19a4 + local_c98._4_4_,
                                    (float)local_e28 * local_19a4 + (float)local_c98);
              uStack_19d0 = CONCAT44(uStack_e20._4_4_ * local_19a4 + uStack_c90._4_4_,
                                     (float)uStack_e20 * local_19a4 + (float)uStack_c90);
              local_d40 = local_1958;
              local_d58 = local_19d8;
              uStack_d50 = uStack_19d0;
              *(undefined8 *)local_1958 = local_19d8;
              *(undefined8 *)(local_1958 + 2) = uStack_19d0;
              local_1908 = local_1908 + 4;
              local_1958 = local_1958 + 4;
              local_e38 = local_19b8;
              uStack_e30 = uStack_19b0;
              local_e28 = uVar1;
              uStack_e20 = uVar2;
              local_c98 = uVar3;
              uStack_c90 = uVar4;
            }
            for (; local_19a8 < local_1368; local_19a8 = local_19a8 + 1) {
              *local_1958 = *local_1908 * local_19a4 + *local_1958;
              local_1908 = local_1908 + 1;
              local_1958 = local_1958 + 1;
            }
            local_12c8 = local_18f8;
            local_be8 = local_19a4;
            fStack_be4 = local_19a4;
            fStack_be0 = local_19a4;
            fStack_bdc = local_19a4;
            local_bd8 = local_19a4;
            local_468 = local_1058;
            local_448 = local_1068;
            local_1980 = local_a28;
            local_1930 = local_7c0;
          }
        }
      }
    }
    if (*(int *)(in_RDI + 0xd0) == 2) {
      local_19e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1338,1);
      for (local_19e4 = 0; local_19e4 < local_1360; local_19e4 = local_19e4 + 1) {
        local_12d8 = &local_1a38;
        local_75c = local_1350->w;
        local_760 = local_1350->h;
        local_764 = local_1350->d;
        local_770 = (undefined1 (*) [16])
                    ((long)local_1350->data +
                    local_1350->cstep * (long)local_19e4 * local_1350->elemsize);
        local_778 = local_1350->elemsize;
        local_77c = local_1350->elempack;
        local_788 = local_1350->allocator;
        local_758 = &local_1a38;
        local_6b8 = (long)local_75c * (long)local_760 * local_778;
        local_11e8 = &local_1a38;
        local_1048 = &local_1a38;
        local_12f0 = &local_1a88;
        local_724 = local_19e0->w;
        local_728 = local_19e0->h;
        local_72c = local_19e0->d;
        local_738 = (undefined1 (*) [16])
                    ((long)local_19e0->data +
                    local_19e0->cstep * (long)local_19e4 * local_19e0->elemsize);
        local_740 = local_19e0->elemsize;
        local_744 = local_19e0->elempack;
        local_750 = local_19e0->allocator;
        local_720 = &local_1a88;
        local_6c8 = (long)local_724 * (long)local_728 * local_740;
        local_11f0 = &local_1a88;
        local_1038 = &local_1a88;
        local_fc8 = &local_1ad8;
        local_9c4 = local_1370->w;
        local_9c8 = local_1370->h;
        local_9cc = local_1370->d;
        local_9d8 = (undefined1 (*) [16])
                    ((long)local_1370->data +
                    local_1370->cstep * (long)local_19e4 * local_1370->elemsize);
        local_9e0 = local_1370->elemsize;
        local_9e4 = local_1370->elempack;
        local_9f0 = local_1370->allocator;
        local_9c0 = &local_1ad8;
        local_608 = (long)local_9c4 * (long)local_9c8 * local_9e0;
        local_ef0 = &local_1ad8;
        local_1028 = &local_1ad8;
        local_1a00 = 0;
        local_1a04 = 0;
        local_1a08 = 0;
        local_1a0c = 0;
        local_1a20 = 0;
        local_1a28 = 0;
        local_1a30 = 0;
        local_1a38 = 0;
        local_1a50 = 0;
        local_1a54 = 0;
        local_1a58 = 0;
        local_1a5c = 0;
        local_1a70 = 0;
        local_1a78 = 0;
        local_1a80 = 0;
        local_1a88 = 0;
        local_60c = 0x10;
        local_6bc = 0x10;
        local_6cc = 0x10;
        local_fd0 = local_1370;
        local_fd4 = local_19e4;
        local_fd5 = 1;
        local_12e0 = local_1350;
        local_12e4 = local_19e4;
        local_12e5 = 1;
        local_12f8 = local_19e0;
        local_12fc = local_19e4;
        local_12fd = 1;
        local_19f8 = 0;
        local_1a10 = 0;
        local_1a48 = 0;
        local_1a60 = 0;
        local_1ad8 = 0;
        local_1ac8 = 0;
        local_1ac0 = 0;
        local_1ab0 = 0;
        local_1aac = 0;
        local_1aa8 = 0;
        local_1aa4 = 0;
        local_1aa0 = 0;
        local_1a98 = 0;
        local_1ad0 = 0;
        local_1a90 = local_9d8;
        local_1a40 = local_738;
        local_19f0 = local_770;
        for (local_1adc = 0; local_4c8 = local_1028, local_4a8 = local_1038, local_488 = local_1048,
            local_1ab8 = local_9f0, local_1a68 = local_750, local_1a18 = local_788,
            local_1adc + 3 < local_1368; local_1adc = local_1adc + 4) {
          local_ea0 = local_19f0;
          local_b58 = *(undefined8 *)*local_19f0;
          uStack_b50 = *(undefined8 *)(*local_19f0 + 8);
          local_ea8 = local_1a40;
          local_1b08 = *(undefined8 *)*local_1a40;
          uStack_1b00 = *(undefined8 *)(*local_1a40 + 8);
          local_1af8 = maxps(*local_19f0,*local_1a40);
          local_d60 = local_1a90;
          local_d78 = local_1af8._0_8_;
          uStack_d70 = local_1af8._8_8_;
          *local_1a90 = local_1af8;
          local_19f0 = local_19f0 + 1;
          local_1a40 = local_1a40 + 1;
          local_1a90 = local_1a90 + 1;
          local_b68 = local_1b08;
          uStack_b60 = uStack_1b00;
        }
        for (; local_1adc < local_1368; local_1adc = local_1adc + 1) {
          pfVar10 = std::max<float>((float *)local_19f0,(float *)local_1a40);
          *(float *)*local_1a90 = *pfVar10;
          local_19f0 = (undefined1 (*) [16])(*local_19f0 + 4);
          local_1a40 = (undefined1 (*) [16])(*local_1a40 + 4);
          local_1a90 = (undefined1 (*) [16])((long)*local_1a90 + 4);
        }
      }
      for (local_1b10 = 2; uVar8 = local_1b10,
          sVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1338),
          uVar8 < sVar9; local_1b10 = local_1b10 + 1) {
        local_1b18 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_1338,local_1b10);
        for (local_1b1c = 0; local_1b1c < local_1360; local_1b1c = local_1b1c + 1) {
          local_1308 = &local_1b70;
          local_6ec = local_1b18->w;
          local_6f0 = local_1b18->h;
          local_6f4 = local_1b18->d;
          local_700 = (undefined1 (*) [16])
                      ((long)local_1b18->data +
                      local_1b18->cstep * (long)local_1b1c * local_1b18->elemsize);
          local_708 = local_1b18->elemsize;
          local_70c = local_1b18->elempack;
          local_718 = local_1b18->allocator;
          local_6e8 = &local_1b70;
          local_6d8 = (long)local_6ec * (long)local_6f0 * local_708;
          local_11f8 = &local_1b70;
          local_1018 = &local_1b70;
          local_fe8 = &local_1bc0;
          local_98c = local_1370->w;
          local_990 = local_1370->h;
          local_994 = local_1370->d;
          local_9a0 = (undefined1 (*) [16])
                      ((long)local_1370->data +
                      local_1370->cstep * (long)local_1b1c * local_1370->elemsize);
          local_9a8 = local_1370->elemsize;
          local_9ac = local_1370->elempack;
          local_9b8 = local_1370->allocator;
          local_988 = &local_1bc0;
          local_618 = (long)local_98c * (long)local_990 * local_9a8;
          local_ef8 = &local_1bc0;
          local_1008 = &local_1bc0;
          local_1b38 = 0;
          local_1b3c = 0;
          local_1b40 = 0;
          local_1b44 = 0;
          local_1b58 = 0;
          local_1b60 = 0;
          local_1b68 = 0;
          local_1b70 = 0;
          local_61c = 0x10;
          local_6dc = 0x10;
          local_ff0 = local_1370;
          local_ff4 = local_1b1c;
          local_ff5 = 1;
          local_1310 = local_1b18;
          local_1314 = local_1b1c;
          local_1315 = 1;
          local_1b30 = 0;
          local_1b48 = 0;
          local_1bc0 = 0;
          local_1bb0 = 0;
          local_1ba8 = 0;
          local_1b98 = 0;
          local_1b94 = 0;
          local_1b90 = 0;
          local_1b8c = 0;
          local_1b88 = 0;
          local_1b80 = 0;
          local_1bb8 = 0;
          local_1b78 = local_9a0;
          local_1b28 = local_700;
          for (local_1bc4 = 0; local_508 = local_1008, local_4e8 = local_1018,
              local_1ba0 = local_9b8, local_1b50 = local_718, local_1bc4 + 3 < local_1368;
              local_1bc4 = local_1bc4 + 4) {
            local_eb0 = local_1b78;
            local_b78 = *(undefined8 *)*local_1b78;
            uStack_b70 = *(undefined8 *)(*local_1b78 + 8);
            local_eb8 = local_1b28;
            local_b88 = *(undefined8 *)*local_1b28;
            uStack_b80 = *(undefined8 *)(*local_1b28 + 8);
            auVar12 = maxps(*local_1b78,*local_1b28);
            local_d80 = local_1b78;
            local_1bd8 = auVar12._0_8_;
            local_d98 = local_1bd8;
            uStack_1bd0 = auVar12._8_8_;
            uStack_d90 = uStack_1bd0;
            *local_1b78 = auVar12;
            local_1b28 = local_1b28 + 1;
            local_1b78 = local_1b78 + 1;
          }
          for (; local_1bc4 < local_1368; local_1bc4 = local_1bc4 + 1) {
            pfVar10 = std::max<float>((float *)local_1b28,(float *)local_1b78);
            *(float *)*local_1b78 = *pfVar10;
            local_1b28 = (undefined1 (*) [16])(*local_1b28 + 4);
            local_1b78 = (undefined1 (*) [16])(*local_1b78 + 4);
          }
        }
      }
    }
    local_1324 = 0;
  }
  return local_1324;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}